

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationShaderInputOutputTests.cpp
# Opt level: O1

TestStatus *
vkt::tessellation::anon_unknown_1::PerPatchData::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDefinition *caseDef)

{
  pointer pfVar1;
  int i;
  long lVar2;
  pointer pfVar3;
  int y;
  int y_00;
  size_type __n;
  int x;
  int x_00;
  long lVar4;
  bool bVar5;
  vector<float,_std::allocator<float>_> vertexData;
  TextureLevel referenceImage;
  PixelBufferAccess access;
  Vec4 local_40;
  
  bVar5 = CASETYPE_PRIMITIVE_ID_TES < caseDef->caseType;
  lVar4 = 8;
  if (bVar5) {
    lVar4 = 1;
  }
  __n = 0x50;
  if (bVar5) {
    __n = 10;
  }
  access.super_ConstPixelBufferAccess.m_format =
       (TextureFormat)((ulong)access.super_ConstPixelBufferAccess.m_format & 0xffffffff00000000);
  std::vector<float,_std::allocator<float>_>::vector
            (&vertexData,__n,(value_type_conflict3 *)&access,(allocator_type *)&referenceImage);
  pfVar1 = vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = 0;
  pfVar3 = vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    *pfVar3 = (float)(int)lVar2 / (float)(int)lVar4;
    lVar2 = lVar2 + 1;
    pfVar3 = pfVar3 + 10;
  } while (lVar4 != lVar2);
  tcu::TextureLevel::TextureLevel(&referenceImage);
  if (caseDef->usesReferenceImageFromFile == true) {
    tcu::ImageIO::loadPNG
              (&referenceImage,context->m_testCtx->m_curArchive,
               (caseDef->referenceImagePath)._M_dataplus._M_p);
  }
  else {
    access.super_ConstPixelBufferAccess.m_format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    tcu::TextureLevel::setStorage(&referenceImage,(TextureFormat *)&access,0x100,0x100,1);
    tcu::TextureLevel::getAccess(&access,&referenceImage);
    local_40.m_data[0] = 1.0;
    local_40.m_data[1] = 1.0;
    local_40.m_data[2] = 1.0;
    local_40.m_data[3] = 1.0;
    y_00 = 0;
    do {
      x_00 = 0;
      do {
        tcu::PixelBufferAccess::setPixel(&access,&local_40,x_00,y_00,0);
        x_00 = x_00 + 1;
      } while (x_00 != 0x100);
      y_00 = y_00 + 1;
    } while (y_00 != 0x100);
  }
  pfVar3 = vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&access.super_ConstPixelBufferAccess,&referenceImage);
  runTest(__return_storage_ptr__,context,(int)lVar4,10,5,VK_FORMAT_R32_SFLOAT,pfVar3,
          (long)vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar1,
          &access.super_ConstPixelBufferAccess);
  tcu::TextureLevel::~TextureLevel(&referenceImage);
  if (vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDefinition caseDef)
{
	DE_ASSERT(!caseDef.usesReferenceImageFromFile || !caseDef.referenceImagePath.empty());

	// Input vertex attribute data
	const int		   numPrimitives	= getNumPrimitives(caseDef.caseType);
	std::vector<float> vertexData		(INPUT_PATCH_SIZE * numPrimitives, 0.0f);
	const VkDeviceSize vertexBufferSize = sizeof(float) * vertexData.size();

	for (int i = 0; i < numPrimitives; ++i)
		vertexData[INPUT_PATCH_SIZE * i] = static_cast<float>(i) / static_cast<float>(numPrimitives);

	tcu::TextureLevel referenceImage;
	if (caseDef.usesReferenceImageFromFile)
		tcu::ImageIO::loadPNG(referenceImage, context.getTestContext().getArchive(), caseDef.referenceImagePath.c_str());
	else
		initializeWhiteReferenceImage(referenceImage, RENDER_SIZE, RENDER_SIZE);

	return runTest(context, numPrimitives, INPUT_PATCH_SIZE, OUTPUT_PATCH_SIZE,
				   VK_FORMAT_R32_SFLOAT, &vertexData[0], vertexBufferSize, referenceImage.getAccess());
}